

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_handle_graph.cpp
# Opt level: O0

void __thiscall
handlegraph::MutablePathHandleGraph::pop_front_step
          (MutablePathHandleGraph *this,path_handle_t *path_handle)

{
  undefined8 in_RSI;
  long *in_RDI;
  step_handle_t next;
  step_handle_t begin;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *this_00;
  undefined1 local_68 [32];
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_48;
  undefined1 local_30 [16];
  undefined1 local_20 [2] [16];
  
  local_20[0] = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x168)) + 0xe8))
                          ((long)in_RDI + *(long *)(*in_RDI + -0x168),in_RSI);
  local_30 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x168)) + 0x118))
                       ((long)in_RDI + *(long *)(*in_RDI + -0x168));
  local_48.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &local_48;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x23cd7f);
  (**(code **)(*in_RDI + 0x188))(local_68,in_RDI,local_20,local_30,this_00);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector(this_00);
  return;
}

Assistant:

void MutablePathHandleGraph::pop_front_step(const path_handle_t& path_handle) {
    step_handle_t begin = path_begin(path_handle);
    step_handle_t next = get_next_step(begin);
    rewrite_segment(begin, next, std::vector<handle_t>());
}